

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmXe_LPGCachePolicyULT.cpp
# Opt level: O0

void __thiscall
CTestXe_LPGCachePolicy::SetUpXe_LPGVariant(CTestXe_LPGCachePolicy *this,PRODUCT_FAMILY platform)

{
  PRODUCT_FAMILY platform_local;
  CTestXe_LPGCachePolicy *this_local;
  
  printf("%s\n");
  if (platform == IGFX_LUNARLAKE) {
    CommonULT::GfxPlatform.eRenderCoreFamily = IGFX_XE2_HPG_CORE;
  }
  else if ((int)platform < 0x4fa) {
    CommonULT::GfxPlatform.eRenderCoreFamily = IGFX_XE_HPG_CORE;
  }
  else {
    CommonULT::GfxPlatform.eRenderCoreFamily = IGFX_XE2_HPG_CORE;
  }
  CommonULT::GfxPlatform.eProductFamily = platform;
  CommonULT::pGfxAdapterInfo = (ADAPTER_INFO *)malloc(0x9bf);
  if (CommonULT::pGfxAdapterInfo != (ADAPTER_INFO *)0x0) {
    memset(CommonULT::pGfxAdapterInfo,0,0x9bf);
    (CommonULT::pGfxAdapterInfo->SkuTable).field_1 =
         (anon_struct_8_38_77a33f9e_for__SKU_FEATURE_TABLE_2)
         ((ulong)(CommonULT::pGfxAdapterInfo->SkuTable).field_1 & 0xfffffffffffbffff | 0x40000);
    (CommonULT::pGfxAdapterInfo->SkuTable).field_1 =
         (anon_struct_8_38_77a33f9e_for__SKU_FEATURE_TABLE_2)
         ((ulong)(CommonULT::pGfxAdapterInfo->SkuTable).field_1 & 0xffffffffffff7fff | 0x8000);
    *(ushort *)&(CommonULT::pGfxAdapterInfo->SkuTable).field_0 =
         *(ushort *)&(CommonULT::pGfxAdapterInfo->SkuTable).field_0 & 0xffbf;
    (CommonULT::pGfxAdapterInfo->SkuTable).field_1 =
         (anon_struct_8_38_77a33f9e_for__SKU_FEATURE_TABLE_2)
         ((ulong)(CommonULT::pGfxAdapterInfo->SkuTable).field_1 & 0xffffffffffdfffff);
    (CommonULT::pGfxAdapterInfo->SkuTable).field_1 =
         (anon_struct_8_38_77a33f9e_for__SKU_FEATURE_TABLE_2)
         ((ulong)(CommonULT::pGfxAdapterInfo->SkuTable).field_1 & 0xfffffffdffffffff);
    (CommonULT::pGfxAdapterInfo->SkuTable).field_1 =
         (anon_struct_8_38_77a33f9e_for__SKU_FEATURE_TABLE_2)
         ((ulong)(CommonULT::pGfxAdapterInfo->SkuTable).field_1 & 0xfffffffffffffffd | 2);
    (CommonULT::pGfxAdapterInfo->SkuTable).field_1 =
         (anon_struct_8_38_77a33f9e_for__SKU_FEATURE_TABLE_2)
         ((ulong)(CommonULT::pGfxAdapterInfo->SkuTable).field_1 & 0xffffffefffffffff | 0x1000000000)
    ;
    *(ushort *)&(CommonULT::pGfxAdapterInfo->SkuTable).field_0 =
         *(ushort *)&(CommonULT::pGfxAdapterInfo->SkuTable).field_0 & 0xfeff;
    if (platform == IGFX_BMG) {
      (CommonULT::pGfxAdapterInfo->SkuTable).field_1 =
           (anon_struct_8_38_77a33f9e_for__SKU_FEATURE_TABLE_2)
           ((ulong)(CommonULT::pGfxAdapterInfo->SkuTable).field_1 & 0xffffffffffdfffff | 0x200000);
      (CommonULT::pGfxAdapterInfo->SkuTable).field_1 =
           (anon_struct_8_38_77a33f9e_for__SKU_FEATURE_TABLE_2)
           ((ulong)(CommonULT::pGfxAdapterInfo->SkuTable).field_1 & 0xfffffffdffffffff | 0x200000000
           );
    }
    if (0x4f9 < (int)platform) {
      *(ushort *)&(CommonULT::pGfxAdapterInfo->SkuTable).field_0 =
           *(ushort *)&(CommonULT::pGfxAdapterInfo->SkuTable).field_0 & 0xfeff | 0x100;
      *(ulong *)&(CommonULT::pGfxAdapterInfo->WaTable).field_0x4 =
           *(ulong *)&(CommonULT::pGfxAdapterInfo->WaTable).field_0x4 & 0xfdffffffffffffff |
           0x200000000000000;
      *(ulong *)&(CommonULT::pGfxAdapterInfo->WaTable).field_0x4 =
           *(ulong *)&(CommonULT::pGfxAdapterInfo->WaTable).field_0x4 & 0xfbffffffffffffff |
           0x400000000000000;
    }
    CommonULT::SetUpTestCase();
  }
  return;
}

Assistant:

void CTestXe_LPGCachePolicy::SetUpXe_LPGVariant(PRODUCT_FAMILY platform)
{
    printf("%s\n", __FUNCTION__);

    GfxPlatform.eProductFamily = platform;

    if (platform == IGFX_LUNARLAKE)
    {
        GfxPlatform.eRenderCoreFamily = IGFX_XE2_LPG_CORE;
    }
    else if (platform >= IGFX_BMG)
    {
        GfxPlatform.eRenderCoreFamily = IGFX_XE2_HPG_CORE;
    }
    else
    {
        GfxPlatform.eRenderCoreFamily = IGFX_XE_HPG_CORE;
    }

    pGfxAdapterInfo = (ADAPTER_INFO *)malloc(sizeof(ADAPTER_INFO));
    if(pGfxAdapterInfo)
    {
        memset(pGfxAdapterInfo, 0, sizeof(ADAPTER_INFO));

        pGfxAdapterInfo->SkuTable.FtrLinearCCS             = 1; //legacy y =>0 - test both
        pGfxAdapterInfo->SkuTable.FtrStandardMipTailFormat = 1;
        pGfxAdapterInfo->SkuTable.FtrTileY                 = 0;
        pGfxAdapterInfo->SkuTable.FtrLocalMemory           = 0;
        pGfxAdapterInfo->SkuTable.FtrDiscrete              = 0;
        pGfxAdapterInfo->SkuTable.FtrIA32eGfxPTEs          = 1;
        pGfxAdapterInfo->SkuTable.FtrL4Cache               = 1;
        pGfxAdapterInfo->SkuTable.FtrL3TransientDataFlush  = 0;

        if (platform == IGFX_BMG)
        {
            pGfxAdapterInfo->SkuTable.FtrLocalMemory = 1;
            pGfxAdapterInfo->SkuTable.FtrDiscrete    = 1;
        }

        if (platform >= IGFX_BMG)
        {
            pGfxAdapterInfo->SkuTable.FtrL3TransientDataFlush = 1;
	    pGfxAdapterInfo->WaTable.Wa_14018976079           = 1;
	    pGfxAdapterInfo->WaTable.Wa_14018984349           = 1;
	}

        CommonULT::SetUpTestCase();
    }
}